

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.hpp
# Opt level: O0

void __thiscall
zmq::encoder_base_t<zmq::v2_encoder_t>::encoder_base_t
          (encoder_base_t<zmq::v2_encoder_t> *this,size_t bufsize_)

{
  _func_int **pp_Var1;
  _func_int **in_RSI;
  i_encoder *in_RDI;
  
  i_encoder::i_encoder(in_RDI);
  in_RDI->_vptr_i_encoder = (_func_int **)&PTR__encoder_base_t_002cc928;
  in_RDI[1]._vptr_i_encoder = (_func_int **)0x0;
  in_RDI[2]._vptr_i_encoder = (_func_int **)0x0;
  in_RDI[4]._vptr_i_encoder = (_func_int **)0x0;
  in_RDI[3]._vptr_i_encoder = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[5]._vptr_i_encoder = 0;
  in_RDI[6]._vptr_i_encoder = in_RSI;
  pp_Var1 = (_func_int **)malloc((size_t)in_RSI);
  in_RDI[7]._vptr_i_encoder = pp_Var1;
  in_RDI[8]._vptr_i_encoder = (_func_int **)0x0;
  if (in_RDI[7]._vptr_i_encoder == (_func_int **)0x0) {
    fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/encoder.hpp"
            ,0x42);
    fflush(_stderr);
    zmq_abort((char *)0x24f714);
  }
  return;
}

Assistant:

explicit encoder_base_t (size_t bufsize_) :
        _write_pos (0),
        _to_write (0),
        _next (NULL),
        _new_msg_flag (false),
        _buf_size (bufsize_),
        _buf (static_cast<unsigned char *> (malloc (bufsize_))),
        _in_progress (NULL)
    {
        alloc_assert (_buf);
    }